

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

String * __thiscall
Json::Reader::getFormattedErrorMessages_abi_cxx11_(String *__return_storage_ptr__,Reader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_type *psVar4;
  long *plVar5;
  _Elt_pointer pEVar6;
  long *local_b8;
  long local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  Reader *local_70;
  _Map_pointer local_68;
  _Elt_pointer local_60;
  String local_58;
  _Elt_pointer local_38;
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar6 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_38 = (this->errors_).
             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar6 != local_38) {
    local_60 = (this->errors_).
               super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
    local_68 = (this->errors_).
               super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    paVar1 = &local_98.field_2;
    local_70 = this;
    do {
      getLocationLineAndColumn_abi_cxx11_(&local_58,local_70,(pEVar6->token_).start_);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x15c3fd);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98.field_2._8_8_ = plVar2[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_98._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_a8 = *plVar5;
        lStack_a0 = plVar2[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar5;
        local_b8 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      std::operator+(&local_98,"  ",&pEVar6->message_);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_a8 = *plVar5;
        lStack_a0 = plVar2[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar5;
        local_b8 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (pEVar6->extra_ != (Location)0x0) {
        getLocationLineAndColumn_abi_cxx11_(&local_58,local_70,pEVar6->extra_);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x15c403);
        psVar4 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_98.field_2._M_allocated_capacity = *psVar4;
          local_98.field_2._8_8_ = puVar3[3];
          local_98._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar4;
          local_98._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_98._M_string_length = puVar3[1];
        *puVar3 = psVar4;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        plVar2 = puVar3 + 2;
        if ((long *)*puVar3 == plVar2) {
          local_a8 = *plVar2;
          lStack_a0 = puVar3[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar2;
          local_b8 = (long *)*puVar3;
        }
        *puVar3 = plVar2;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
      pEVar6 = pEVar6 + 1;
      if (pEVar6 == local_60) {
        pEVar6 = local_68[1];
        local_68 = local_68 + 1;
        local_60 = pEVar6 + 8;
      }
    } while (pEVar6 != local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

String Reader::getFormattedErrorMessages() const {
  String formattedMessage;
  for (const auto& error : errors_) {
    formattedMessage +=
        "* " + getLocationLineAndColumn(error.token_.start_) + "\n";
    formattedMessage += "  " + error.message_ + "\n";
    if (error.extra_)
      formattedMessage +=
          "See " + getLocationLineAndColumn(error.extra_) + " for detail.\n";
  }
  return formattedMessage;
}